

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O1

double fdim(double __x,double __y)

{
  bool bVar1;
  ExactFloat *in_RDX;
  ExactFloat *in_RSI;
  ExactFloat *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  
  if (((in_RSI->bn_exp_ != 0x7fffffff) && (in_RDX->bn_exp_ != 0x7fffffff)) &&
     (bVar1 = operator<(in_RDX,in_RSI), !bVar1)) {
    ExactFloat::ExactFloat(in_RDI,0);
    return extraout_XMM0_Qa_00;
  }
  ExactFloat::SignedSum(in_RDI,in_RSI->sign_,in_RSI,-in_RDX->sign_,in_RDX);
  return extraout_XMM0_Qa;
}

Assistant:

ExactFloat fdim(const ExactFloat& a, const ExactFloat& b) {
  // This formulation has the correct behavior for NaNs.
  return (a <= b) ? 0 : (a - b);
}